

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app.cpp
# Opt level: O2

Error * __thiscall
ot::commissioner::CommissionerApp::GetActiveDataset
          (Error *__return_storage_ptr__,CommissionerApp *this,ActiveOperationalDataset *aDataset,
          uint16_t aDatasetFlags)

{
  ErrorCode EVar1;
  Error *pEVar2;
  undefined1 auStack_48 [40];
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  (*((this->mCommissioner).
     super___shared_ptr<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_Commissioner[0x1a])(auStack_48);
  pEVar2 = Error::operator=(__return_storage_ptr__,(Error *)auStack_48);
  EVar1 = pEVar2->mCode;
  std::__cxx11::string::~string((string *)(auStack_48 + 8));
  if (EVar1 == kNone) {
    MergeDataset(&this->mActiveDataset,aDataset);
  }
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerApp::GetActiveDataset(ActiveOperationalDataset &aDataset, uint16_t aDatasetFlags)
{
    Error error;

    SuccessOrExit(error = mCommissioner->GetActiveDataset(aDataset, aDatasetFlags));
    MergeDataset(mActiveDataset, aDataset);

exit:
    return error;
}